

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_crossed(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t y1;
  wchar_t y2;
  wchar_t x1;
  wchar_t wVar1;
  wchar_t wVar2;
  chunk *c_00;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  loc lVar7;
  wchar_t wVar8;
  wchar_t y1_00;
  wchar_t light;
  wchar_t wVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  bool bVar12;
  wchar_t wVar13;
  loc local_68;
  wchar_t local_60;
  wchar_t local_5c;
  chunk *local_58;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t local_44;
  ulong local_40;
  ulong local_38;
  
  wVar10 = c->depth;
  local_68 = (loc)centre;
  uVar4 = Rand_div(0x19);
  iVar5 = rand_range(3,4);
  iVar6 = rand_range(3,0xb);
  wVar8 = iVar5 * 2 + L'\x03';
  if (iVar5 * 2 + 1 < 3) {
    wVar8 = L'\x05';
  }
  wVar11 = iVar6 * 2 + L'\x03';
  if (iVar6 < 2) {
    wVar11 = L'\x05';
  }
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar8,wVar11);
  if (((c->height <= local_68.y) || (c->width <= local_68.x)) &&
     (_Var3 = find_space((loc_conflict *)&local_68,wVar8,wVar11), !_Var3)) {
    return false;
  }
  wVar1 = local_68.x;
  wVar2 = local_68.y;
  local_38 = (ulong)(uint)(local_68.y - iVar5);
  wVar8 = local_68.x + L'\xffffffff';
  local_48 = local_68.y + iVar5;
  wVar11 = local_68.x + L'\x01';
  y1 = local_68.y + L'\xffffffff';
  local_40 = (ulong)(uint)(local_68.x - iVar6);
  y2 = local_68.y + L'\x01';
  local_44 = local_68.x + iVar6;
  y1_00 = (local_68.y - iVar5) + L'\xffffffff';
  x1 = local_68.x + L'\xfffffffe';
  wVar9 = local_68.y + L'\x01' + iVar5;
  local_5c = local_68.x + L'\x02';
  light = (wchar_t)(wVar10 <= uVar4 + L'\x01');
  local_58 = c;
  generate_room(c,y1_00,x1,wVar9,local_5c,light);
  c_00 = local_58;
  wVar10 = wVar2 + L'\xfffffffe';
  local_4c = (int)local_40 + L'\xffffffff';
  local_60 = wVar2 + L'\x02';
  wVar13 = wVar1 + L'\x01' + iVar6;
  generate_room(local_58,wVar10,local_4c,local_60,wVar13,light);
  draw_rectangle(c_00,y1_00,x1,wVar9,local_5c,L'\x15',L'\f',false);
  draw_rectangle(c_00,wVar10,local_4c,local_60,wVar13,L'\x15',L'\f',false);
  fill_rectangle(c_00,(wchar_t)local_38,wVar8,local_48,wVar11,L'\x01',L'\0');
  wVar13 = L'\0';
  wVar9 = L'\x01';
  fill_rectangle(c_00,y1,(wchar_t)local_40,y2,local_44,L'\x01',L'\0');
  uVar4 = Rand_div(4);
  if (uVar4 == 3) {
    uVar4 = Rand_div(3);
    if (uVar4 == 0) {
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pinched");
      iVar5 = 1;
      wVar8 = wVar10;
      do {
        wVar8 = wVar8 + L'\x01';
        bVar12 = iVar5 != 0;
        iVar5 = iVar5 + -1;
        if (bVar12) {
          lVar7 = (loc)loc(x1,wVar8);
          square_set_feat((chunk_conflict *)c_00,lVar7,L'\x15');
          generate_mark(c_00,lVar7.y,lVar7.x,lVar7.y,lVar7.x,L'\v');
          lVar7 = (loc)loc(local_5c,wVar8);
          square_set_feat((chunk_conflict *)c_00,lVar7,L'\x15');
          generate_mark(c_00,lVar7.y,lVar7.x,lVar7.y,lVar7.x,L'\v');
        }
      } while (wVar8 <= wVar2);
      iVar5 = 1;
      wVar8 = x1;
      do {
        wVar8 = wVar8 + L'\x01';
        bVar12 = iVar5 != 0;
        iVar5 = iVar5 + -1;
        if (bVar12) {
          lVar7 = (loc)loc(wVar8,wVar10);
          square_set_feat((chunk_conflict *)c_00,lVar7,L'\x15');
          generate_mark(c_00,lVar7.y,lVar7.x,lVar7.y,lVar7.x,L'\v');
          lVar7 = (loc)loc(wVar8,local_60);
          square_set_feat((chunk_conflict *)c_00,lVar7,L'\x15');
          generate_mark(c_00,lVar7.y,lVar7.x,lVar7.y,lVar7.x,L'\v');
        }
      } while (wVar8 <= wVar1);
      uVar4 = Rand_div(3);
      if (uVar4 == 0) {
        iVar5 = wVar2 * 2 >> 1;
        iVar6 = wVar1 * 2 >> 1;
        lVar7 = (loc)loc(iVar6,wVar10);
        square_set_feat((chunk_conflict *)c_00,lVar7,L'\x02');
        lVar7 = (loc)loc(x1,iVar5);
        square_set_feat((chunk_conflict *)c_00,lVar7,L'\x02');
        lVar7 = (loc)loc(iVar6,local_60);
        square_set_feat((chunk_conflict *)c_00,lVar7,L'\x02');
        lVar7 = (loc)loc(local_5c,iVar5);
        square_set_feat((chunk_conflict *)c_00,lVar7,L'\x02');
      }
    }
    else {
      uVar4 = Rand_div(3);
      if (uVar4 == 0) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plus");
        generate_plus(c_00,y1,wVar8,y2,wVar11,wVar9,wVar13);
      }
      else {
        uVar4 = Rand_div(3);
        if (uVar4 == 0) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
          lVar7 = local_68;
          square_set_feat((chunk_conflict *)c_00,local_68,L'\x15');
          wVar8 = lVar7.y;
          wVar10 = lVar7.x;
          generate_mark(c_00,wVar8,wVar10,wVar8,wVar10,L'\v');
        }
      }
    }
  }
  else if (uVar4 == 2) {
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"inner vault");
    draw_rectangle(c_00,y1,wVar8,y2,wVar11,L'\x15',L'\v',false);
    generate_hole(c_00,y1,wVar8,y2,wVar11,L'\x0f');
    lVar7 = local_68;
    place_object((chunk_conflict *)c_00,(loc_conflict)local_68,c_00->depth,false,false,'\x03',L'\0')
    ;
    wVar8 = c_00->depth;
    uVar4 = Rand_div(2);
    vault_monsters((chunk_conflict *)c_00,(loc_conflict)lVar7,wVar8 + L'\x02',uVar4 + L'\x03');
    uVar4 = Rand_div(3);
    vault_traps((chunk_conflict *)c_00,(loc_conflict)lVar7,L'\x04',L'\x04',uVar4 + L'\x02');
  }
  else {
    if (uVar4 != 1) {
      return true;
    }
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"solid middle");
    fill_rectangle(c_00,y1,wVar8,y2,wVar11,L'\x15',L'\v');
  }
  return true;
}

Assistant:

bool build_crossed(struct chunk *c, struct loc centre, int rating)
{
	int y, x;
	int height, width;

	int y1a, x1a, y2a, x2a;
	int y1b, x1b, y2b, x2b;

	int dy, dx, wy, wx;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Pick inner dimension */
	wy = 1;
	wx = 1;

	/* Pick outer dimension */
	dy = rand_range(3, 4);
	dx = rand_range(3, 11);

	/* Determine extents of room (a) */
	y1a = dy;
	x1a = wx;
	y2a = dy;
	x2a = wx;

	/* Determine extents of room (b) */
	y1b = wy;
	x1b = dx;
	y2b = wy;
	x2b = dx;

	/* Calculate height and width */
	height = MAX(y1a + y2a + 1, y1b + y2b + 1);
	width = MAX(x1a + x2a + 1, x1b + x2b + 1);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if (centre.y >= c->height || centre.x >= c->width) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* locate room (b) */
	y1a = centre.y - dy;
	x1a = centre.x - wx;
	y2a = centre.y + dy;
	x2a = centre.x + wx;

	/* locate room (b) */
	y1b = centre.y - wy;
	x1b = centre.x - dx;
	y2b = centre.y + wy;
	x2b = centre.x + dx;

	/* Generate new room (a) */
	generate_room(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, light);

	/* Generate new room (b) */
	generate_room(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, light);

	/* Generate outer walls (a) */
	draw_rectangle(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate outer walls (b) */
	draw_rectangle(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate inner floors (a) */
	fill_rectangle(c, y1a, x1a, y2a, x2a, FEAT_FLOOR, SQUARE_NONE);

	/* Generate inner floors (b) */
	fill_rectangle(c, y1b, x1b, y2b, x2b, FEAT_FLOOR, SQUARE_NONE);

	/* Special features */
	switch (randint1(4)) {
		/* Nothing */
	case 1: break;

		/* Large solid middle pillar */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"solid middle");
		fill_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE, SQUARE_WALL_INNER);
		break;
	}

		/* Inner treasure vault */
	case 3: {
		/* Generate a small inner vault */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"inner vault");
		draw_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE,
			SQUARE_WALL_INNER, false);

		/* Open the inner vault with a secret door */
		generate_hole(c, y1b, x1a, y2b, x2a, FEAT_SECRET);

		/* Place a treasure in the vault */
		place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);

		/* Let's guard the treasure well */
		vault_monsters(c, centre, c->depth + 2, randint0(2) + 3);

		/* Traps naturally */
		vault_traps(c, centre, 4, 4, randint0(3) + 2);

		break;
	}

		/* Something else */
	case 4: {
		if (one_in_(3)) {
			/* Occasionally pinch the center shut */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pinched");

			/* Pinch the east/west sides */
			for (y = y1b; y <= y2b; y++) {
				if (y == centre.y) continue;
				set_marked_granite(c, loc(x1a - 1, y), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x2a + 1, y), SQUARE_WALL_INNER);
			}

			/* Pinch the north/south sides */
			for (x = x1a; x <= x2a; x++) {
				if (x == centre.x) continue;
				set_marked_granite(c, loc(x, y1b - 1), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x, y2b + 1), SQUARE_WALL_INNER);
			}

			/* Open sides with doors */
			if (one_in_(3))
				generate_open(c, y1b - 1, x1a - 1, y2b + 1, x2a + 1,
							  FEAT_CLOSED);

		} else if (one_in_(3)) {
			/* Occasionally put a "plus" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"plus");
			generate_plus(c, y1b, x1a, y2b, x2a, 
						  FEAT_GRANITE, SQUARE_WALL_INNER);

		} else if (one_in_(3)) {
			/* Occasionally put a "pillar" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pillar");
			set_marked_granite(c, centre, SQUARE_WALL_INNER);
		}

		break;
	}
	}

	return true;
}